

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_3537c6::Db::parseExprPrimary(Db *this)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  undefined **ppuVar7;
  char *pcVar8;
  long lVar9;
  short *psVar10;
  char *pcVar11;
  StringView SVar12;
  char *__end2;
  
  psVar2 = (short *)this->First;
  psVar3 = (short *)this->Last;
  if (psVar2 == psVar3) {
    return (Node *)0x0;
  }
  if ((char)*psVar2 != 'L') {
    return (Node *)0x0;
  }
  psVar1 = (short *)((long)psVar2 + 1);
  this->First = (char *)psVar1;
  if (psVar3 == psVar1) {
switchD_0018dc22_caseD_55:
    pNVar5 = parseType(this);
    if (pNVar5 == (Node *)0x0) {
      return (Node *)0x0;
    }
    SVar12 = parseNumber(this,false);
    pcVar8 = this->First;
    if (SVar12.First != SVar12.Last) {
      if (pcVar8 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar8 == 'E') {
        this->First = pcVar8 + 1;
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar6->K = KExpr;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d39b0;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar5;
        *(StringView *)&pNVar6[1].K = SVar12;
        return pNVar6;
      }
      return (Node *)0x0;
    }
    if (pcVar8 == this->Last) {
      return (Node *)0x0;
    }
LAB_0018dcf0:
    if (*pcVar8 == 'E') {
      this->First = pcVar8 + 1;
      return pNVar5;
    }
    return (Node *)0x0;
  }
  switch(*(char *)psVar1) {
  case 'T':
    return (Node *)0x0;
  default:
    goto switchD_0018dc22_caseD_55;
  case '_':
    if ((ulong)((long)psVar3 - (long)psVar1) < 2) {
      return (Node *)0x0;
    }
    if (*psVar1 != 0x5a5f) {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 3);
    pNVar5 = parseEncoding(this);
    if (pNVar5 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pcVar8 = this->First;
    if (pcVar8 == this->Last) {
      return (Node *)0x0;
    }
    goto LAB_0018dcf0;
  case 'a':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "signed char";
    pcVar8 = "";
    break;
  case 'b':
    if ((ulong)((long)psVar3 - (long)psVar1) < 3) {
      return (Node *)0x0;
    }
    if (*(char *)((long)psVar2 + 3) == 'E' && *psVar1 == 0x3062) {
      this->First = (char *)(psVar2 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x10);
      pNVar5->K = KExpr;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3850;
      pNVar5->field_0xc = 0;
      return pNVar5;
    }
    if (*(char *)((long)psVar2 + 3) == 'E' && *psVar1 == 0x3162) {
      this->First = (char *)(psVar2 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x10);
      pNVar5->K = KExpr;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3850;
      pNVar5->field_0xc = 1;
      return pNVar5;
    }
    return (Node *)0x0;
  case 'c':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "char";
    pcVar8 = "";
    break;
  case 'd':
    psVar1 = psVar2 + 1;
    this->First = (char *)psVar1;
    if ((ulong)((long)psVar3 - (long)psVar1) < 0x11) {
      return (Node *)0x0;
    }
    psVar10 = psVar2 + 9;
    lVar9 = 0;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar1 + lVar9));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
    this->First = (char *)psVar10;
    if (psVar10 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar10 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0x13);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_001d3900;
    goto LAB_0018df58;
  case 'e':
    this->First = (char *)(psVar2 + 1);
    if ((ulong)((long)psVar3 - (long)(psVar2 + 1)) < 0x15) {
      return (Node *)0x0;
    }
    psVar10 = psVar2 + 0xb;
    lVar9 = 2;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar2 + lVar9));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x16);
    this->First = (char *)psVar10;
    if (psVar10 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar10 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0x17);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_001d3958;
    goto LAB_0018df58;
  case 'f':
    psVar1 = psVar2 + 1;
    this->First = (char *)psVar1;
    if ((ulong)((long)psVar3 - (long)psVar1) < 9) {
      return (Node *)0x0;
    }
    psVar10 = psVar2 + 5;
    lVar9 = 0;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar1 + lVar9));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    this->First = (char *)psVar10;
    if (psVar10 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar10 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0xb);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_001d38a8;
LAB_0018df58:
    pNVar5->_vptr_Node = (_func_int **)ppuVar7;
    pNVar5[1]._vptr_Node = (_func_int **)(psVar2 + 1);
    *(short **)&pNVar5[1].K = psVar10;
    return pNVar5;
  case 'h':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "unsigned char";
    pcVar8 = "";
    break;
  case 'i':
    this->First = (char *)(psVar2 + 1);
    pcVar8 = "";
    pcVar11 = "";
    break;
  case 'j':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "u";
    pcVar8 = "";
    break;
  case 'l':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "l";
    pcVar8 = "";
    break;
  case 'm':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "ul";
    pcVar8 = "";
    break;
  case 'n':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "__int128";
    pcVar8 = "";
    break;
  case 'o':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "unsigned __int128";
    pcVar8 = "";
    break;
  case 's':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "short";
    pcVar8 = "";
    break;
  case 't':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "unsigned short";
    pcVar8 = "";
    break;
  case 'w':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "wchar_t";
    pcVar8 = "";
    break;
  case 'x':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "ll";
    pcVar8 = "";
    break;
  case 'y':
    this->First = (char *)(psVar2 + 1);
    pcVar11 = "ull";
    pcVar8 = "";
  }
  SVar12.Last = pcVar8;
  SVar12.First = pcVar11;
  pNVar5 = parseIntegerLiteral(this,SVar12);
  return pNVar5;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }